

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
atoiTest_testInt64OutOfBoundsLow_Test::~atoiTest_testInt64OutOfBoundsLow_Test
          (atoiTest_testInt64OutOfBoundsLow_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(atoiTest, testInt64OutOfBoundsLow) {
  // out of bounds
  test<int64_t>(false, "-1111111111111111111111111111111111111111111111111111111"); 
  test<int64_t>(false, "-111111111111111111111111111111111111111"); 
  test<int64_t>(false, "-9223372036854775810943"); 
  test<int64_t>(false, "-9223372036854775810"); 
  test<int64_t>(false, "-9223372036854775809"); 
}